

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsum.c
# Opt level: O1

int bsumMain(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool_t bVar3;
  u32 uVar4;
  int iVar5;
  file_t file;
  char *pcVar6;
  size_t sVar7;
  char **ppcVar8;
  int iVar9;
  ulong hid;
  char *pcVar10;
  char *pcVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  size_t sVar16;
  int iVar17;
  octet hash [64];
  char str [136];
  long local_4a0;
  long local_498;
  octet local_478 [63];
  char acStack_439 [1033];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  bsum [hash_alg] <file_to_hash> <file_to_hash> ...\n  bsum [hash_alg] -c <checksum_file>\n  hash_alg:\n    -belt-hash (STB 34.101.31), by default\n    -bash32, -bash64, ..., -bash512 (STB 34.101.77)\n    -bash-prg-hashNNND (STB 34.101.77)\n      with NNN in {256, 384, 512}, D in {1, 2}\n      \\note annonce = NULL\n  \\remark use \"--\" to stop parsing options"
           ,"bsum","hash files using {belt|bash} algorithms");
  }
  else {
    ppcVar8 = argv + 1;
    iVar9 = argc + -1;
    if (iVar9 == 0) {
      bVar2 = false;
      uVar15 = 0xffffffffffffffff;
      iVar9 = 0;
      iVar13 = 0;
    }
    else {
      uVar15 = 0xffffffffffffffff;
      bVar2 = false;
      iVar17 = 0;
      do {
        bVar3 = strStartsWith(*ppcVar8,"-");
        iVar13 = iVar17;
        if (bVar3 == 0) goto LAB_00102e19;
        bVar3 = strStartsWith(*ppcVar8,"-belt-hash");
        if (bVar3 == 0) {
          bVar3 = strStartsWith(*ppcVar8,"-bash-prg-hash");
          pcVar10 = *ppcVar8;
          if (bVar3 == 0) {
            bVar3 = strStartsWith(pcVar10,"-bash");
            pcVar10 = *ppcVar8;
            if (bVar3 != 0) {
              sVar7 = strLen("-bash");
              if (uVar15 == 0xffffffffffffffff) {
                pcVar10 = pcVar10 + sVar7;
                bVar3 = decIsValid(pcVar10);
                uVar15 = 0xffffffffffffffff;
                if (((bVar3 != 0) && (sVar7 = strLen(pcVar10), 1 < sVar7)) &&
                   (sVar7 = strLen(pcVar10), sVar7 < 5)) goto LAB_00102cf9;
              }
              goto LAB_00102d57;
            }
            iVar13 = strCmp(pcVar10,"-c");
            if (iVar13 != 0) {
              iVar5 = strCmp(*ppcVar8,"--");
              iVar13 = 0x25b;
              if (iVar5 == 0) {
                iVar9 = iVar9 + -1;
                ppcVar8 = ppcVar8 + 1;
                iVar13 = iVar17;
              }
              goto LAB_00102e19;
            }
            if (bVar2) goto LAB_00102e0c;
            iVar9 = iVar9 + -1;
            ppcVar8 = ppcVar8 + 1;
            bVar2 = true;
          }
          else {
            sVar7 = strLen("-bash-prg-hash");
            if (uVar15 == 0xffffffffffffffff) {
              pcVar10 = pcVar10 + sVar7;
              bVar3 = decIsValid(pcVar10);
              uVar15 = 0xffffffffffffffff;
              if ((bVar3 == 0) || (sVar7 = strLen(pcVar10), sVar7 != 4)) goto LAB_00102d57;
LAB_00102cf9:
              uVar15 = 0xffffffffffffffff;
              sVar7 = decCLZ(pcVar10);
              if (sVar7 != 0) goto LAB_00102d57;
              uVar4 = decToU32(pcVar10);
              uVar15 = (ulong)uVar4;
              bVar3 = bsumHidIsValid(uVar15);
              if (bVar3 == 0) goto LAB_00102d57;
              iVar9 = iVar9 + -1;
              ppcVar8 = ppcVar8 + 1;
              bVar1 = true;
            }
            else {
LAB_00102d57:
              iVar17 = 0x25b;
              bVar1 = false;
            }
            iVar13 = iVar17;
            if (!bVar1) goto LAB_00102e19;
          }
        }
        else {
          if (uVar15 != 0xffffffffffffffff) {
LAB_00102e0c:
            iVar13 = 0x25b;
            goto LAB_00102e19;
          }
          iVar9 = iVar9 + -1;
          ppcVar8 = ppcVar8 + 1;
          uVar15 = 0;
        }
      } while (iVar9 != 0);
      iVar9 = 0;
      iVar13 = iVar17;
    }
LAB_00102e19:
    if ((iVar13 == 0) && ((iVar9 < 1 || ((iVar13 = 0, bVar2 && (iVar9 != 1)))))) {
      iVar13 = 0x25b;
    }
    if (iVar13 == 0) {
      hid = 0;
      if (uVar15 != 0xffffffffffffffff) {
        hid = uVar15;
      }
      if (!bVar2) {
        if (iVar9 == 0) {
          return 0;
        }
        uVar15 = hid >> 3;
        if (0x200 < hid) {
          uVar15 = hid / 0x50;
        }
        sVar7 = 0x20;
        if (hid != 0) {
          sVar7 = uVar15;
        }
        pcVar10 = acStack_439 + 1;
        lVar12 = 0;
        iVar13 = 0;
        do {
          iVar5 = bsumHash(local_478,hid,ppcVar8[lVar12]);
          iVar17 = -1;
          if (iVar5 == 0) {
            hexFrom(pcVar10,local_478,sVar7);
            hexLower(pcVar10);
            printf("%s  %s\n",pcVar10,ppcVar8[lVar12]);
            iVar17 = iVar13;
          }
          iVar13 = iVar17;
          lVar12 = lVar12 + 1;
        } while (iVar9 != (int)lVar12);
        return iVar13;
      }
      pcVar10 = *ppcVar8;
      if (hid == 0) {
        uVar15 = 0x20;
      }
      else if (hid < 0x201) {
        uVar15 = hid >> 3;
      }
      else {
        uVar15 = hid / 0x50;
      }
      file = fileOpen(pcVar10,"rb");
      if (file == (file_t)0x0) {
        pcVar11 = "%s: No such file\n";
      }
      else {
        pcVar11 = acStack_439 + 1;
        pcVar6 = fileGets(pcVar11,0x400,file);
        if (pcVar6 == (char *)0x0) {
          lVar12 = 0;
          lVar14 = 0;
          local_498 = 0;
          local_4a0 = 0;
        }
        else {
          local_4a0 = 0;
          local_498 = 0;
          lVar14 = 0;
          lVar12 = 0;
          do {
            sVar7 = strLen(pcVar11);
            if (((sVar7 < uVar15 * 2 + 2) || (acStack_439[uVar15 * 2 + 1] != ' ')) ||
               (acStack_439[uVar15 * 2 + 2] != ' ')) {
LAB_0010307a:
              lVar14 = lVar14 + 1;
            }
            else {
              acStack_439[uVar15 * 2 + 1] = '\0';
              bVar3 = hexIsValid(pcVar11);
              if (bVar3 == 0) goto LAB_0010307a;
              sVar16 = sVar7;
              if (acStack_439[sVar7] == '\n') {
                sVar16 = sVar7 - 1;
                acStack_439[sVar7] = '\0';
              }
              if (pcVar11[sVar16 - 1] == '\r') {
                acStack_439[sVar16] = '\0';
              }
              iVar9 = bsumHash(local_478,hid,acStack_439 + uVar15 * 2 + 3);
              if (iVar9 == -1) {
                local_498 = local_498 + 1;
              }
              else {
                bVar3 = hexEq(local_478,pcVar11);
                if (bVar3 == 0) {
                  local_4a0 = local_4a0 + 1;
                  pcVar6 = "%s: FAILED [checksum]\n";
                }
                else {
                  pcVar6 = "%s: OK\n";
                }
                printf(pcVar6,acStack_439 + uVar15 * 2 + 3);
              }
            }
            lVar12 = lVar12 + 1;
            pcVar6 = fileGets(pcVar11,0x400,file);
          } while (pcVar6 != (char *)0x0);
        }
        bVar3 = fileClose(file);
        if (bVar3 != 0) {
          if (lVar14 != 0) {
            pcVar10 = "WARNING: %lu input lines (out of %lu) are improperly formatted\n";
            if (lVar14 == 1) {
              pcVar10 = "WARNING: %lu input line (out of %lu) is improperly formatted\n";
            }
            fprintf(_stderr,pcVar10,lVar14,lVar12);
          }
          if (local_498 != 0) {
            bsumMain_cold_2();
          }
          if (local_4a0 != 0) {
            bsumMain_cold_3();
          }
          return -(uint)((local_498 != 0 || lVar14 != 0) || local_4a0 != 0);
        }
        pcVar11 = "%s: FAILED [close]\n";
      }
      printf(pcVar11,pcVar10);
    }
    else {
      bsumMain_cold_1();
    }
  }
  return -1;
}

Assistant:

int bsumMain(int argc, char* argv[])
{
	err_t code = ERR_OK;
	size_t hid = SIZE_MAX;
	bool_t check = FALSE;
#ifdef OS_WIN
	setlocale(LC_ALL, "russian_belarus.1251");
#endif
	// справка
	if (argc < 2)
		return bsumUsage();
	// разбор опций
	++argv, --argc;
	while (argc && strStartsWith(argv[0], "-"))
	{
		// belt-hash
		if (strStartsWith(argv[0], "-belt-hash"))
		{
			if (hid != SIZE_MAX)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			hid = 0;
			--argc, ++argv;
		}
		// bash-prg-hash
		else if (strStartsWith(argv[0], "-bash-prg-hash"))
		{
			char* alg_name = argv[0] + strLen("-bash-prg-hash");
			if (hid != SIZE_MAX || !decIsValid(alg_name) ||
				strLen(alg_name) != 4 || decCLZ(alg_name) ||
				!bsumHidIsValid(hid = (size_t)decToU32(alg_name)))
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			--argc, ++argv;
		}
		// bash
		else if (strStartsWith(argv[0], "-bash"))
		{
			char* alg_name = argv[0] + strLen("-bash");
			if (hid != SIZE_MAX || !decIsValid(alg_name) ||
				2 > strLen(alg_name) || strLen(alg_name) > 4 ||
				decCLZ(alg_name) ||
				!bsumHidIsValid(hid = (size_t)decToU32(alg_name)))
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			--argc, ++argv;
		}
		// check
		else if (strEq(argv[0], "-c"))
		{
			if (check)
			{
				code = ERR_CMD_PARAMS;
				break;
			}
			check = TRUE;
			--argc, ++argv;
		}
		// --
		else if (strEq(argv[0], "--"))
		{
			--argc, ++argv;
			break;
		}
		else
		{
			code = ERR_CMD_PARAMS;
			break;
		}
	}
	// дополнительные проверки и обработка ошибок
	if (code == ERR_OK && (argc < 1 || check && argc != 1))
		code = ERR_CMD_PARAMS;
	if (code != ERR_OK)
	{
		fprintf(stderr, "bee2cmd/%s: %s\n", _name, errMsg(code));
		return -1;
	}
	// belt-hash по умолчанию
	if (hid == SIZE_MAX)
		hid = 0;
	// вычисление/проверка хэш-значениий
	ASSERT(bsumHidIsValid(hid));
	return check ? bsumCheck(hid, argv[0]) : bsumPrint(hid, argc, argv);
}